

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

ssize_t Curl_cf_send(Curl_easy *data,int num,void *mem,size_t len,_Bool eos,CURLcode *code)

{
  bool bVar1;
  ssize_t nwritten;
  Curl_cfilter *cf;
  CURLcode *code_local;
  _Bool eos_local;
  size_t len_local;
  void *mem_local;
  int num_local;
  Curl_easy *data_local;
  
  *code = CURLE_OK;
  nwritten = (ssize_t)data->conn->cfilter[num];
  while( true ) {
    bVar1 = false;
    if (nwritten != 0) {
      bVar1 = (*(byte *)(nwritten + 0x24) & 1) == 0;
    }
    if (!bVar1) break;
    nwritten = *(ssize_t *)(nwritten + 8);
  }
  if (nwritten == 0) {
    Curl_failf(data,"send: no filter connected");
    *code = CURLE_FAILED_INIT;
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)
                 (**(code **)(*(long *)nwritten + 0x48))(nwritten,data,mem,len,eos,code);
  }
  return (ssize_t)data_local;
}

Assistant:

ssize_t Curl_cf_send(struct Curl_easy *data, int num,
                     const void *mem, size_t len, bool eos,
                     CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *code = CURLE_OK;
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    ssize_t nwritten = cf->cft->do_send(cf, data, mem, len, eos, code);
    DEBUGASSERT(nwritten >= 0 || *code);
    DEBUGASSERT(nwritten < 0 || !*code || !len);
    return nwritten;
  }
  failf(data, "send: no filter connected");
  DEBUGASSERT(0);
  *code = CURLE_FAILED_INIT;
  return -1;
}